

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::InlineBuiltInLibraryCall(Lowerer *this,Instr *callInstr)

{
  RegOpnd *regOpnd;
  _func_int **pp_Var1;
  Instr *pIVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  BuiltinFunction index;
  ArgSlot AVar6;
  undefined4 *puVar7;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  LabelInstr *target;
  Lowerer *pLVar10;
  MemRefOpnd *compareSrc2;
  LabelInstr *bailOutLabelHelper;
  BranchInstr *instr;
  char *callInstr_00;
  uint uVar11;
  Lowerer *this_00;
  LabelInstr *callInstr_01;
  long lVar12;
  Opnd *pOVar13;
  LabelInstr *doneLabel;
  undefined8 in_stack_ffffffffffffff80;
  LabelInstr *doneLabel_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_68;
  undefined6 uStack_66;
  Opnd *argsOpnd [3];
  
  uVar11 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  pLVar10 = (Lowerer *)callInstr->m_src1;
  pOVar13 = callInstr->m_src2;
  OVar4 = IR::Opnd::GetKind(pOVar13);
  if (OVar4 != OpndKindSym) {
    return false;
  }
  OVar4 = IR::Opnd::GetKind(pOVar13);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  pSVar9 = (StackSym *)pOVar13[1]._vptr_Opnd;
  if ((pSVar9->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  AVar6 = StackSym::GetArgSlotNum(pSVar9);
  lVar12 = (ulong)AVar6 - 1;
  index = Func::GetBuiltInIndex((Opnd *)pLVar10);
  if (index._value < 0x11) {
    if ((1 < index._value - 8) && (index._value != '\0')) {
      return false;
    }
    if (lVar12 != 1) {
      return false;
    }
    if (callInstr->m_dst == (Opnd *)0x0) {
      return false;
    }
  }
  else if (index._value == '\x11') {
    if (lVar12 != 2) {
      return false;
    }
    bVar5 = ShouldGenerateStringReplaceFastPath(pLVar10,callInstr,2);
    if (!bVar5) {
      return false;
    }
  }
  else {
    if (index._value != ')') {
      return false;
    }
    if (lVar12 != 1) {
      return false;
    }
    if (callInstr->m_dst != (Opnd *)0x0) {
      return false;
    }
    pSVar8 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
    pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
    if (((pSVar9->field_0x18 & 1) == 0) || ((pSVar9->field_5).m_instrDef == (Instr *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2e71,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar5) goto LAB_005e057c;
      *puVar7 = 0;
    }
    pSVar8 = IR::Opnd::AsSymOpnd(((pSVar9->field_5).m_instrDef)->m_src2);
    pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
    if (((pSVar9->field_0x18 & 1) == 0) || ((pSVar9->field_5).m_instrDef == (Instr *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2e73,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar5) goto LAB_005e057c;
      *puVar7 = 0;
    }
    pLVar10 = (Lowerer *)((pSVar9->field_5).m_instrDef)->m_src1;
    this_00 = pLVar10;
    OVar4 = IR::Opnd::GetKind((Opnd *)pLVar10);
    if ((OVar4 != OpndKindReg) ||
       (bVar5 = ShouldGenerateArrayFastPath(this_00,(Opnd *)pLVar10,false,false,false), !bVar5)) {
      return false;
    }
    local_68 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(pLVar10->m_lowererMD).FloatPrefThreshold;
    bVar5 = ValueType::IsLikelyNativeArray((ValueType *)&local_68.field_0);
    if (bVar5) {
      return false;
    }
  }
  bVar5 = Func::IsBuiltInInlinedInLowerer(callInstr->m_src1);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2e9a,"(Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()))",
                       "Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1())");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  regOpnd = (RegOpnd *)callInstr->m_src1;
  target = IR::LabelInstr::New(Label,this->m_func,true);
  OVar4 = IR::Opnd::GetKind((Opnd *)regOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  pLVar10 = (Lowerer *)GetObjRefForBuiltInTarget(this,regOpnd);
  compareSrc2 = IR::MemRefOpnd::New(pLVar10,TyInt64,this->m_func,AddrOpndKindDynamicMisc);
  doneLabel_00 = (LabelInstr *)((ulong)uVar11 << 0x20);
  callInstr_00 = (char *)0xd;
  callInstr_01 = target;
  doneLabel = (LabelInstr *)callInstr;
  InsertCompareBranch(pLVar10,(Opnd *)regOpnd,&compareSrc2->super_Opnd,BrNeq_A,false,target,
                      callInstr,false);
  IR::Instr::InsertBefore(callInstr,&target->super_Instr);
  if (3 < AVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    callInstr_00 = "argCount <= 2";
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ea6,"(argCount <= 2)","argCount <= 2");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  pOVar13 = callInstr->m_src2;
  OVar4 = IR::Opnd::GetKind(pOVar13);
  if (OVar4 == OpndKindSym) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      OVar4 = IR::Opnd::GetKind(pOVar13);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        callInstr_00 = "Bad call to AsSymOpnd()";
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_005e057c;
        *puVar7 = 0;
      }
      pp_Var1 = pOVar13[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        callInstr_00 = "Bad call to AsStackSym()";
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_005e057c;
        *puVar7 = 0;
      }
      if (((ulong)pp_Var1[3] & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        callInstr_00 = "sym->m_isSingleDef";
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2eaf,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar5) goto LAB_005e057c;
        *puVar7 = 0;
      }
      pIVar2 = (Instr *)pp_Var1[5];
      if (lVar12 < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        callInstr_00 = "argCount >= 0";
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2eb2,"(argCount >= 0)","argCount >= 0");
        if (!bVar5) goto LAB_005e057c;
        *puVar7 = 0;
      }
      *(Opnd **)(&local_68 + lVar12 * 4) = pIVar2->m_src1;
      lVar12 = lVar12 + -1;
      IR::Instr::Unlink(pIVar2);
      IR::Instr::InsertAfter(&target->super_Instr,pIVar2);
      pOVar13 = pIVar2->m_src2;
      OVar4 = IR::Opnd::GetKind(pOVar13);
    } while (OVar4 == OpndKindSym);
  }
  if (lVar12 != -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    callInstr_00 = "argCount == -1";
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ebb,"(argCount == -1)","argCount == -1");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  OVar4 = IR::Opnd::GetKind(pOVar13);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    callInstr_00 = "linkOpnd->IsRegOpnd()";
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ebe,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  OVar4 = IR::Opnd::GetKind(pOVar13);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    callInstr_00 = "Bad call to AsRegOpnd()";
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  pp_Var1 = pOVar13[1]._vptr_Opnd;
  if (((ulong)pp_Var1[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    callInstr_00 = "sym->m_isSingleDef";
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ec0,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  pIVar2 = (Instr *)pp_Var1[5];
  if (pIVar2->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    callInstr_00 = "startCall->m_opcode == Js::OpCode::StartCall";
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ec2,"(startCall->m_opcode == Js::OpCode::StartCall)",
                       "startCall->m_opcode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_005e057c;
    *puVar7 = 0;
  }
  IR::Instr::Unlink(pIVar2);
  IR::Instr::InsertAfter(&target->super_Instr,pIVar2);
  bailOutLabelHelper = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(callInstr,&bailOutLabelHelper->super_Instr);
  uVar11 = (uint)index._value;
  if (index._value < 0x11) {
    if (uVar11 - 8 < 2) {
      bVar5 = GenerateFastCharAt(this,index,callInstr->m_dst,
                                 (Opnd *)CONCAT62(uStack_66,local_68.bits),argsOpnd[0],
                                 &callInstr_01->super_Instr,&target->super_Instr,target,
                                 bailOutLabelHelper);
      goto LAB_005e0556;
    }
    if (uVar11 == 0) {
      LowererMD::GenerateFastAbs
                (&this->m_lowererMD,callInstr->m_dst,argsOpnd[0],callInstr,&target->super_Instr,
                 target,bailOutLabelHelper);
    }
    else {
LAB_005e0502:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,12000,"((0))","UNREACHED");
      if (!bVar5) {
LAB_005e057c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
  }
  else if (uVar11 == 0x11) {
    GenerateFastReplace(this,(Opnd *)CONCAT62(uStack_66,local_68.bits),argsOpnd[0],argsOpnd[1],
                        callInstr,&target->super_Instr,target,doneLabel_00);
  }
  else {
    if (uVar11 != 0x29) goto LAB_005e0502;
    GenerateFastPush(this,(Opnd *)CONCAT62(uStack_66,local_68.bits),argsOpnd[0],
                     (Instr *)callInstr_00,&target->super_Instr,target,doneLabel,bailOutLabelHelper,
                     false);
  }
  bVar5 = true;
LAB_005e0556:
  instr = IR::BranchInstr::New(JMP,bailOutLabelHelper,this->m_func);
  IR::Instr::InsertBefore(&target->super_Instr,&instr->super_Instr);
  return bVar5;
}

Assistant:

bool
Lowerer::InlineBuiltInLibraryCall(IR::Instr *callInstr)
{
    IR::Opnd *src1 = callInstr->GetSrc1();
    IR::Opnd *src2 = callInstr->GetSrc2();

    // Get the arg count by looking at the slot number of the last arg symbol.

    if (!src2->IsSymOpnd())
    {
        // No args? Not sure this is possible, but handle it.
        return false;
    }

    StackSym *argLinkSym = src2->AsSymOpnd()->m_sym->AsStackSym();
    // Subtract "this" from the arg count.
    IntConstType argCount = argLinkSym->GetArgSlotNum() - 1;

    // Find the callee's built-in index (if any).
    Js::BuiltinFunction index = Func::GetBuiltInIndex(src1);

    // Warning!
    // Don't add new built-in to following switch. Built-ins needs to be inlined in call direct way.
    // Following is only for prejit scenarios where we don't get inlining always and generate fast path in lowerer.
    // Generating fastpath here misses fixed functions and globopt optimizations.
    switch(index)
    {
        case Js::BuiltinFunction::JavascriptString_CharAt:
        case Js::BuiltinFunction::JavascriptString_CharCodeAt:
            if (argCount != 1)
            {
                return false;
            }
            if (!callInstr->GetDst())
            {
                // Optimization of Char[Code]At assumes result is used.
                return false;
            }
            break;
        case Js::BuiltinFunction::Math_Abs:
#ifdef _M_IX86
            if (!AutoSystemInfo::Data.SSE2Available())
            {
                return false;
            }
#endif
            if (argCount != 1)
            {
                return false;
            }
            if (!callInstr->GetDst())
            {
                // Optimization of Abs assumes result is used.
                return false;
            }
            break;

        case Js::BuiltinFunction::JavascriptArray_Push:
        {
            if (argCount != 1)
            {
                return false;
            }
            if (callInstr->GetDst())
            {
                // Optimization of push assumes result is unused.
                return false;
            }

            StackSym *linkSym = callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
            Assert(linkSym->IsSingleDef());
            linkSym = linkSym->m_instrDef->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
            Assert(linkSym->IsSingleDef());

            IR::Opnd *const arrayOpnd = linkSym->m_instrDef->GetSrc1();
            if(!arrayOpnd->IsRegOpnd())
            {
                // This should be rare, but needs to be handled.
                // By now, we've already started some of the inlining.  Simply jmp to the helper.
                // The branch will get peeped later.
                return false;
            }

            if(!ShouldGenerateArrayFastPath(arrayOpnd, false, false, false) ||
               arrayOpnd->GetValueType().IsLikelyNativeArray())
            {
                // Rejecting native array for now, since we have to do a FromVar at the call site and bail out.
                return false;
            }

            break;
        }

        case Js::BuiltinFunction::JavascriptString_Replace:
        {
            if(argCount != 2)
            {
                return false;
            }

            if(!ShouldGenerateStringReplaceFastPath(callInstr, argCount))
            {
                return false;
            }
            break;
        }

        default:
            return false;
    }

    Assert(Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()));

    IR::Opnd *callTargetOpnd = callInstr->GetSrc1();

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    IR::Opnd *objRefOpnd = IR::MemRefOpnd::New((void*)this->GetObjRefForBuiltInTarget(callTargetOpnd->AsRegOpnd()), TyMachReg, this->m_func);

    InsertCompareBranch(callTargetOpnd, objRefOpnd, Js::OpCode::BrNeq_A, labelHelper, callInstr);

    callInstr->InsertBefore(labelHelper);

    Assert(argCount <= 2);

    IR::Opnd *argsOpnd[3];
    IR::Opnd *linkOpnd = callInstr->GetSrc2();

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd * symOpnd = linkOpnd->AsSymOpnd();
        StackSym *sym = symOpnd->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;

        Assert(argCount >= 0);
        argsOpnd[argCount] = argInstr->GetSrc1();
        argCount--;

        argInstr->Unlink();
        labelHelper->InsertAfter(argInstr);

        linkOpnd = argInstr->GetSrc2();
    }
    AnalysisAssert(argCount == -1);

    //  Move startcall
    Assert(linkOpnd->IsRegOpnd());
    StackSym *sym = linkOpnd->AsRegOpnd()->m_sym;
    Assert(sym->m_isSingleDef);
    IR::Instr *startCall = sym->m_instrDef;
    Assert(startCall->m_opcode == Js::OpCode::StartCall);
    startCall->Unlink();
    labelHelper->InsertAfter(startCall);

    // $doneLabel:
    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    callInstr->InsertAfter(doneLabel);

    bool success = true;
    switch(index)
    {
        case Js::BuiltinFunction::Math_Abs:
            this->m_lowererMD.GenerateFastAbs(callInstr->GetDst(), argsOpnd[1], callInstr, labelHelper, labelHelper, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptString_CharCodeAt:
        case Js::BuiltinFunction::JavascriptString_CharAt:
            success = GenerateFastCharAt(index, callInstr->GetDst(), argsOpnd[0], argsOpnd[1],
                callInstr, labelHelper, labelHelper, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptArray_Push:
            success = GenerateFastPush(argsOpnd[0], argsOpnd[1], callInstr, labelHelper, labelHelper, nullptr, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptString_Replace:
            success = GenerateFastReplace(argsOpnd[0], argsOpnd[1], argsOpnd[2], callInstr, labelHelper, labelHelper, doneLabel);
            break;

        default:
            Assert(UNREACHED);
    }

    IR::Instr *instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, doneLabel, this->m_func);
    labelHelper->InsertBefore(instr);

    return success;
}